

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O1

void __thiscall
leveldb::AddBoundaryInputsTest_TestEmptyCompactionFiles_Test::TestBody
          (AddBoundaryInputsTest_TestEmptyCompactionFiles_Test *this)

{
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *this_00;
  pointer *pppFVar1;
  iterator __position;
  size_type sVar2;
  FileMetaData *pFVar3;
  int line;
  undefined8 *puVar4;
  pointer *__ptr;
  char *message;
  char *in_R9;
  bool bVar5;
  AssertionResult gtest_ar_;
  FileMetaData *f1;
  AssertionResult gtest_ar;
  AssertHelper local_b8;
  Message local_b0;
  undefined8 *local_a8;
  FileMetaData *local_a0;
  string local_98;
  string local_78;
  AssertHelper local_58;
  string local_50;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_98._M_dataplus._M_p = "100";
  local_98._M_string_length = 3;
  local_98.field_2._M_allocated_capacity = 2;
  local_98.field_2._8_4_ = 1;
  AppendInternalKey(&local_78,(ParsedInternalKey *)&local_98);
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_98._M_dataplus._M_p = "100";
  local_98._M_string_length = 3;
  local_98.field_2._M_allocated_capacity = 1;
  local_98.field_2._8_4_ = 1;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  AppendInternalKey(&local_50,(ParsedInternalKey *)&local_98);
  pFVar3 = AddBoundaryInputsTest::CreateFileMetaData
                     (&this->super_AddBoundaryInputsTest,1,(InternalKey *)&local_78,
                      (InternalKey *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  this_00 = &(this->super_AddBoundaryInputsTest).level_files_;
  __position._M_current =
       (this->super_AddBoundaryInputsTest).level_files_.
       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_a0 = pFVar3;
  if (__position._M_current ==
      (this->super_AddBoundaryInputsTest).level_files_.
      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
    _M_realloc_insert<leveldb::FileMetaData*const&>
              ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)this_00,
               __position,&local_a0);
  }
  else {
    *__position._M_current = pFVar3;
    pppFVar1 = &(this->super_AddBoundaryInputsTest).level_files_.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppFVar1 = *pppFVar1 + 1;
  }
  AddBoundaryInputs(&(this->super_AddBoundaryInputsTest).icmp_,this_00,
                    &(this->super_AddBoundaryInputsTest).compaction_files_);
  bVar5 = (this->super_AddBoundaryInputsTest).compaction_files_.
          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          (this->super_AddBoundaryInputsTest).compaction_files_.
          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_b0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = bVar5;
  local_a8 = (undefined8 *)0x0;
  if (bVar5) {
    local_b8.data_._0_4_ = 1;
    local_b0.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )((long)(this->super_AddBoundaryInputsTest).level_files_.
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->super_AddBoundaryInputsTest).level_files_.
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&local_98,"1","level_files_.size()",(int *)&local_b8,
               (unsigned_long *)&local_b0);
    sVar2 = local_98._M_string_length;
    if ((char)local_98._M_dataplus._M_p == '\0') {
      testing::Message::Message(&local_b0);
      if ((undefined8 *)local_98._M_string_length == (undefined8 *)0x0) {
        message = "";
      }
      else {
        message = *(char **)local_98._M_string_length;
      }
      line = 0xea;
    }
    else {
      if ((undefined8 *)local_98._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_98._M_string_length !=
            (undefined8 *)(local_98._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_98._M_string_length);
        }
        operator_delete((void *)sVar2);
      }
      testing::internal::CmpHelperEQ<leveldb::FileMetaData*,leveldb::FileMetaData*>
                ((internal *)&local_98,"f1","level_files_[0]",&local_a0,
                 (this_00->
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                 )._M_impl.super__Vector_impl_data._M_start);
      puVar4 = (undefined8 *)local_98._M_string_length;
      if ((char)local_98._M_dataplus._M_p != '\0') goto LAB_001105a0;
      testing::Message::Message(&local_b0);
      if ((undefined8 *)local_98._M_string_length == (undefined8 *)0x0) {
        message = "";
      }
      else {
        message = *(char **)local_98._M_string_length;
      }
      line = 0xeb;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
               ,line,message);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    puVar4 = (undefined8 *)local_98._M_string_length;
    if (local_b0.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_b0.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
      puVar4 = (undefined8 *)local_98._M_string_length;
    }
  }
  else {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_b0,(AssertionResult *)"compaction_files_.empty()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
               ,0xe9,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    puVar4 = local_a8;
    if ((long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) + 8))();
      puVar4 = local_a8;
    }
  }
LAB_001105a0:
  if (puVar4 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar4 != puVar4 + 2) {
      operator_delete((undefined8 *)*puVar4);
    }
    operator_delete(puVar4);
  }
  return;
}

Assistant:

TEST_F(AddBoundaryInputsTest, TestEmptyCompactionFiles) {
  FileMetaData* f1 =
      CreateFileMetaData(1, InternalKey("100", 2, kTypeValue),
                         InternalKey(InternalKey("100", 1, kTypeValue)));
  level_files_.push_back(f1);

  AddBoundaryInputs(icmp_, level_files_, &compaction_files_);
  ASSERT_TRUE(compaction_files_.empty());
  ASSERT_EQ(1, level_files_.size());
  ASSERT_EQ(f1, level_files_[0]);
}